

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LoopGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::MemberSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,
          ExpressionSyntax *args_6,Token *args_7,ExpressionSyntax *args_8,Token *args_9,
          ExpressionSyntax *args_10,Token *args_11,MemberSyntax *args_12)

{
  Token keyword;
  Token openParen;
  Token equals;
  Token semi1;
  Token semi2;
  Token closeParen;
  Token genvar;
  Token identifier;
  LoopGenerateSyntax *this_00;
  Token *args_local_4;
  Token *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (LoopGenerateSyntax *)allocate(this,0xe0,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  openParen.kind = args_2->kind;
  openParen._2_1_ = args_2->field_0x2;
  openParen.numFlags.raw = (args_2->numFlags).raw;
  openParen.rawLen = args_2->rawLen;
  openParen.info = args_2->info;
  genvar.kind = args_3->kind;
  genvar._2_1_ = args_3->field_0x2;
  genvar.numFlags.raw = (args_3->numFlags).raw;
  genvar.rawLen = args_3->rawLen;
  genvar.info = args_3->info;
  identifier.kind = args_4->kind;
  identifier._2_1_ = args_4->field_0x2;
  identifier.numFlags.raw = (args_4->numFlags).raw;
  identifier.rawLen = args_4->rawLen;
  identifier.info = args_4->info;
  equals.kind = args_5->kind;
  equals._2_1_ = args_5->field_0x2;
  equals.numFlags.raw = (args_5->numFlags).raw;
  equals.rawLen = args_5->rawLen;
  equals.info = args_5->info;
  semi1.kind = args_7->kind;
  semi1._2_1_ = args_7->field_0x2;
  semi1.numFlags.raw = (args_7->numFlags).raw;
  semi1.rawLen = args_7->rawLen;
  semi1.info = args_7->info;
  semi2.kind = args_9->kind;
  semi2._2_1_ = args_9->field_0x2;
  semi2.numFlags.raw = (args_9->numFlags).raw;
  semi2.rawLen = args_9->rawLen;
  semi2.info = args_9->info;
  closeParen.kind = args_11->kind;
  closeParen._2_1_ = args_11->field_0x2;
  closeParen.numFlags.raw = (args_11->numFlags).raw;
  closeParen.rawLen = args_11->rawLen;
  closeParen.info = args_11->info;
  slang::syntax::LoopGenerateSyntax::LoopGenerateSyntax
            (this_00,args,keyword,openParen,genvar,identifier,equals,args_6,semi1,args_8,semi2,
             args_10,closeParen,args_12);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }